

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O3

VmConstant * ExtractValue(InstructionVMEvalContext *ctx,VmConstant *value,uint offset,VmType type)

{
  Allocator *pAVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  VmConstant *pVVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar6;
  double *__src;
  VmValueType VVar7;
  
  uVar6 = type._0_8_;
  if (value->sValue == (char *)0x0) {
    __assert_fail("value->sValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                  ,0x102,
                  "VmConstant *ExtractValue(InstructionVMEvalContext &, VmConstant *, unsigned int, VmType)"
                 );
  }
  uVar2 = type.size;
  if ((value->super_VmValue).type.size < offset + uVar2) {
    __assert_fail("offset + type.size <= value->type.size",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                  ,0x103,
                  "VmConstant *ExtractValue(InstructionVMEvalContext &, VmConstant *, unsigned int, VmType)"
                 );
  }
  __src = (double *)(value->sValue + offset);
  VVar7 = type.type;
  if ((VVar7 == VM_TYPE_INT) && (uVar2 == 4)) {
    pVVar5 = CreateConstantInt(ctx->allocator,(SynBase *)0x0,*(int *)__src);
    return pVVar5;
  }
  if ((VVar7 == VM_TYPE_DOUBLE) && (uVar2 == 8)) {
    pVVar5 = CreateConstantDouble(ctx->allocator,(SynBase *)0x0,*__src);
    return pVVar5;
  }
  if ((VVar7 == VM_TYPE_LONG) && (uVar2 == 8)) {
    pVVar5 = CreateConstantLong(ctx->allocator,(SynBase *)0x0,(longlong)*__src);
    return pVVar5;
  }
  if (VVar7 != VM_TYPE_POINTER) {
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,uVar6 >> 0x20);
    memcpy((char *)CONCAT44(extraout_var,iVar3),__src,uVar6 >> 0x20);
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xd8);
    pVVar5 = (VmConstant *)CONCAT44(extraout_var_00,iVar4);
    pAVar1 = ctx->allocator;
    (pVVar5->super_VmValue).typeID = 1;
    (pVVar5->super_VmValue).type.type = (int)uVar6;
    (pVVar5->super_VmValue).type.size = (int)(uVar6 >> 0x20);
    (pVVar5->super_VmValue).type.structType = type.structType;
    (pVVar5->super_VmValue).source = (SynBase *)0x0;
    (pVVar5->super_VmValue).comment.begin = (char *)0x0;
    (pVVar5->super_VmValue).comment.end = (char *)0x0;
    (pVVar5->super_VmValue).users.allocator = pAVar1;
    (pVVar5->super_VmValue).users.data = (pVVar5->super_VmValue).users.little;
    (pVVar5->super_VmValue).users.count = 0;
    (pVVar5->super_VmValue).users.max = 8;
    (pVVar5->super_VmValue).hasKnownNonSimpleUse = false;
    (pVVar5->super_VmValue).hasSideEffects = false;
    (pVVar5->super_VmValue).hasMemoryAccess = false;
    (pVVar5->super_VmValue).canBeRemoved = true;
    (pVVar5->super_VmValue).hasKnownSimpleUse = false;
    (pVVar5->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmValue_003e8d38;
    pVVar5->iValue = 0;
    pVVar5->sValue = (char *)0x0;
    pVVar5->bValue = (VmBlock *)0x0;
    pVVar5->fValue = (VmFunction *)0x0;
    pVVar5->container = (VariableData *)0x0;
    pVVar5->dValue = 0.0;
    pVVar5->lValue = 0;
    pVVar5->isFloat = false;
    pVVar5->isReference = false;
    pVVar5->sValue = (char *)CONCAT44(extraout_var,iVar3);
    return pVVar5;
  }
  if ((ulong)*__src >> 0x20 == 0) {
    pVVar5 = CreateConstantPointer
                       (ctx->allocator,(SynBase *)0x0,SUB84(*__src,0),(VariableData *)0x0,
                        type.structType,false);
    return pVVar5;
  }
  __assert_fail("unsigned(pointer) == pointer",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                ,0x128,
                "VmConstant *ExtractValue(InstructionVMEvalContext &, VmConstant *, unsigned int, VmType)"
               );
}

Assistant:

VmConstant* ExtractValue(InstructionVMEvalContext &ctx, VmConstant *value, unsigned offset, VmType type)
{
	assert(value->sValue);
	assert(offset + type.size <= value->type.size);

	const char *source = value->sValue + offset;

	if(type == VmType::Int)
	{
		int tmp = 0;
		memcpy(&tmp, source, sizeof(tmp));
		return CreateConstantInt(ctx.allocator, NULL, tmp);
	}
	else if(type == VmType::Double)
	{
		double tmp = 0;
		memcpy(&tmp, source, sizeof(tmp));
		return CreateConstantDouble(ctx.allocator, NULL, tmp);
	}
	else if(type == VmType::Long)
	{
		long long tmp = 0;
		memcpy(&tmp, source, sizeof(tmp));
		return CreateConstantLong(ctx.allocator, NULL, tmp);
	}
	else if(type.type == VM_TYPE_POINTER)
	{
		unsigned long long pointer = 0;

		if(sizeof(void*) == 4)
		{
			unsigned tmp;
			memcpy(&tmp, source, sizeof(void*));
			pointer = tmp;
		}
		else
		{
			memcpy(&pointer, source, sizeof(void*));
		}

		assert(unsigned(pointer) == pointer);

		return CreateConstantPointer(ctx.allocator, NULL, unsigned(pointer), NULL, type.structType, false);
	}
	else
	{
		char *tmp = (char*)ctx.allocator->alloc(type.size);
		memcpy(tmp, source, type.size);

		VmConstant *result = new (ctx.get<VmConstant>()) VmConstant(ctx.allocator, type, NULL);

		result->sValue = tmp;

		return result;
	}
}